

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

int32 prime_size(int32 size)

{
  bool bVar1;
  int local_10;
  int32 i;
  int32 size_local;
  
  local_10 = 0;
  while( true ) {
    bVar1 = false;
    if (0 < prime[local_10]) {
      bVar1 = prime[local_10] < size;
    }
    if (!bVar1) break;
    local_10 = local_10 + 1;
  }
  if (prime[local_10] < 1) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/hash_table.c"
            ,0x97,"Very large hash table requested (%d entries)\n",(ulong)(uint)size);
    local_10 = local_10 + -1;
  }
  return prime[local_10];
}

Assistant:

static int32
prime_size(int32 size)
{
    int32 i;

    for (i = 0; (prime[i] > 0) && (prime[i] < size); i++);
    if (prime[i] <= 0) {
        E_WARN("Very large hash table requested (%d entries)\n", size);
        --i;
    }
    return (prime[i]);
}